

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  __ssize_t _Var2;
  long lVar3;
  bool bVar4;
  char byte;
  char local_19;
  
  lVar3 = 0;
  this->fixed_buffer_used_size_ = 0;
  (this->glowable_buffer_)._M_string_length = 0;
  *(this->glowable_buffer_)._M_dataplus._M_p = '\0';
  do {
    iVar1 = (*this->strm_->_vptr_Stream[2])(this->strm_,&local_19,1);
    if (iVar1 < 0) {
      bVar4 = false;
      _Var2 = 0;
    }
    else if (iVar1 == 0) {
      _Var2 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),lVar3 != 0);
      bVar4 = false;
    }
    else {
      append(this,local_19);
      bVar4 = local_19 != '\n';
      _Var2 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    lVar3 = lVar3 + -1;
  } while (bVar4);
  return _Var2;
}

Assistant:

bool getline() {
    fixed_buffer_used_size_ = 0;
    glowable_buffer_.clear();

    for (size_t i = 0;; i++) {
      char byte;
      auto n = strm_.read(&byte, 1);

      if (n < 0) {
        return false;
      } else if (n == 0) {
        if (i == 0) {
          return false;
        } else {
          break;
        }
      }

      append(byte);

      if (byte == '\n') { break; }
    }

    return true;
  }